

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O3

void squall::detail::defun_global<void,std::shared_ptr<Foo>>
               (HSQUIRRELVM vm,HSQOBJECT *table,string *name,
               function<void_(std::shared_ptr<Foo>)> *f)

{
  long *plVar1;
  size_type *psVar2;
  HSQOBJECT obj;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  obj._4_4_ = 0;
  obj._type = table->_type;
  obj._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj);
  TypeMaskList<std::shared_ptr<Foo>>::doit_abi_cxx11_();
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x13006b);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_60.field_2._M_allocated_capacity = *psVar2;
    local_60.field_2._8_8_ = plVar1[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar2;
    local_60._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_60._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  defun<2,void,std::shared_ptr<Foo>>(vm,name,f,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  sq_pop(vm,1);
  return;
}

Assistant:

void defun_global(
    HSQUIRRELVM vm, const HSQOBJECT& table,
    const string& name, const std::function<R (T...)>& f) {

    sq_pushobject(vm, table);
    defun<2>(vm, name, f, _SC(".") + TypeMaskList<T...>::doit());
    sq_pop(vm, 1);
}